

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

Pipe __thiscall perfetto::base::Pipe::Create(Pipe *this,Flags flags)

{
  ScopedPlatformHandle *this_00;
  code *pcVar1;
  int iVar2;
  uint uVar3;
  uint *puVar4;
  char *pcVar5;
  PlatformHandle fds [2];
  int local_30;
  int local_2c;
  Pipe local_28;
  
  iVar2 = pipe(&local_30);
  if (iVar2 == 0) {
    iVar2 = fcntl(local_30,2,1);
    if (iVar2 != 0) goto LAB_00267c5a;
    iVar2 = fcntl(local_2c,2,1);
    if (iVar2 != 0) goto LAB_00267c5f;
    Pipe(this);
    ScopedResource<int,_&perfetto::base::CloseFile,_-1,_true,_perfetto::base::internal::DefaultValidityChecker<int,_-1>_>
    ::reset(&this->rd,local_30);
    this_00 = &this->wr;
    ScopedResource<int,_&perfetto::base::CloseFile,_-1,_true,_perfetto::base::internal::DefaultValidityChecker<int,_-1>_>
    ::reset(this_00,local_2c);
    if (1 < flags - kBothNonBlock) {
LAB_00267c06:
      if ((flags & ~kRdNonBlock) != kBothNonBlock) {
        return (Pipe)this;
      }
      uVar3 = fcntl(this_00->t_,3,0);
      if ((int)uVar3 < 0) {
        Create(&local_28);
        puVar4 = (uint *)__errno_location();
        uVar3 = *puVar4;
        pcVar5 = strerror(uVar3);
        LogMessage(kLogError,(char *)local_28,0x1653,"%s (errno: %d, %s)",
                   "PERFETTO_CHECK(cur_flags >= 0)",(ulong)uVar3,pcVar5);
      }
      else {
        iVar2 = fcntl(this_00->t_,4,(ulong)(uVar3 | 0x800));
        if (iVar2 == 0) {
          return (Pipe)this;
        }
        Create(&local_28);
        puVar4 = (uint *)__errno_location();
        uVar3 = *puVar4;
        pcVar5 = strerror(uVar3);
        LogMessage(kLogError,(char *)local_28,0x1654,"%s (errno: %d, %s)",
                   "PERFETTO_CHECK(fcntl(*p.wr, F_SETFL, cur_flags | O_NONBLOCK) == 0)",(ulong)uVar3
                   ,pcVar5);
      }
      goto LAB_00267d8c;
    }
    uVar3 = fcntl((this->rd).t_,3,0);
    if (-1 < (int)uVar3) {
      iVar2 = fcntl((this->rd).t_,4,(ulong)(uVar3 | 0x800));
      if (iVar2 != 0) {
        Create(&local_28);
        puVar4 = (uint *)__errno_location();
        uVar3 = *puVar4;
        pcVar5 = strerror(uVar3);
        LogMessage(kLogError,(char *)local_28,0x164e,"%s (errno: %d, %s)",
                   "PERFETTO_CHECK(fcntl(*p.rd, F_SETFL, cur_flags | O_NONBLOCK) == 0)",(ulong)uVar3
                   ,pcVar5);
        goto LAB_00267d8c;
      }
      goto LAB_00267c06;
    }
  }
  else {
    Create();
LAB_00267c5a:
    Create();
LAB_00267c5f:
    Create();
  }
  Create(&local_28);
  puVar4 = (uint *)__errno_location();
  uVar3 = *puVar4;
  pcVar5 = strerror(uVar3);
  LogMessage(kLogError,(char *)local_28,0x164d,"%s (errno: %d, %s)","PERFETTO_CHECK(cur_flags >= 0)"
             ,(ulong)uVar3,pcVar5);
LAB_00267d8c:
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

Pipe Pipe::Create(Flags flags) {
  PlatformHandle fds[2];
#if PERFETTO_BUILDFLAG(PERFETTO_OS_WIN)
  PERFETTO_CHECK(::CreatePipe(&fds[0], &fds[1], /*lpPipeAttributes=*/nullptr,
                              0 /*default size*/));
#else
  PERFETTO_CHECK(pipe(fds) == 0);
  PERFETTO_CHECK(fcntl(fds[0], F_SETFD, FD_CLOEXEC) == 0);
  PERFETTO_CHECK(fcntl(fds[1], F_SETFD, FD_CLOEXEC) == 0);
#endif
  Pipe p;
  p.rd.reset(fds[0]);
  p.wr.reset(fds[1]);

#if !PERFETTO_BUILDFLAG(PERFETTO_OS_WIN)
  if (flags == kBothNonBlock || flags == kRdNonBlock) {
    int cur_flags = fcntl(*p.rd, F_GETFL, 0);
    PERFETTO_CHECK(cur_flags >= 0);
    PERFETTO_CHECK(fcntl(*p.rd, F_SETFL, cur_flags | O_NONBLOCK) == 0);
  }

  if (flags == kBothNonBlock || flags == kWrNonBlock) {
    int cur_flags = fcntl(*p.wr, F_GETFL, 0);
    PERFETTO_CHECK(cur_flags >= 0);
    PERFETTO_CHECK(fcntl(*p.wr, F_SETFL, cur_flags | O_NONBLOCK) == 0);
  }
#else
  PERFETTO_CHECK(flags == kBothBlock);
#endif
  return p;
}